

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  ushort *puVar18;
  char *pcVar19;
  ushort *puVar20;
  char *pcVar21;
  char *pcVar22;
  size_t prefixSize;
  char cVar23;
  char *pcVar24;
  long lStack_b0;
  long lStack_60;
  int iStack_58;
  
  iStack_58 = (int)source;
  if (dictSize == 0) {
    puVar20 = (ushort *)0xffffffffffffffff;
    if (-1 < maxOutputSize && source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          puVar20 = (ushort *)(ulong)-(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        pbVar2 = (byte *)(source + compressedSize);
        pcVar22 = dest + (uint)maxOutputSize;
        pcVar9 = pcVar22 + -7;
        puVar20 = (ushort *)source;
        pcVar14 = dest;
LAB_00112200:
        do {
          puVar18 = (ushort *)((long)puVar20 + 1);
          bVar3 = (byte)*puVar20;
          sVar12 = (size_t)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) {
            lStack_60 = -1;
            if (puVar18 < pbVar2 + -0xf) {
              lStack_60 = 0;
              puVar20 = puVar20 + 1;
              do {
                puVar18 = puVar20;
                if (pbVar2 + -0xf < puVar18) {
                  lStack_60 = -1;
                  break;
                }
                lStack_60 = lStack_60 + (ulong)*(byte *)((long)puVar18 + -1);
                puVar20 = (ushort *)((long)puVar18 + 1);
              } while ((ulong)*(byte *)((long)puVar18 + -1) == 0xff);
            }
            puVar20 = puVar18;
            cVar23 = '\x05';
            sVar12 = 0xf;
            if ((lStack_60 != -1) && (sVar12 = lStack_60 + 0xf, !CARRY8((ulong)pcVar14,sVar12))) {
              cVar23 = CARRY8((ulong)puVar20,sVar12) * '\x05';
            }
            puVar18 = puVar20;
            if (cVar23 != '\0') {
              if (cVar23 == '\x05') goto LAB_001124c3;
              goto LAB_001124c8;
            }
LAB_00112279:
            puVar20 = puVar18;
            pcVar15 = pcVar14 + sVar12;
            if ((pcVar22 + -0xc < pcVar15) ||
               (puVar18 = (ushort *)((long)puVar20 + sVar12), pbVar2 + -8 < puVar18)) {
              if (((byte *)((long)puVar20 + sVar12) != pbVar2) || (pcVar22 < pcVar15))
              goto LAB_001124c3;
              memmove(pcVar14,puVar20,sVar12);
              puVar20 = (ushort *)(ulong)(uint)((int)pcVar15 - (int)dest);
              goto LAB_001124c8;
            }
            do {
              *(undefined8 *)pcVar14 = *(undefined8 *)puVar20;
              pcVar14 = pcVar14 + 8;
              puVar20 = puVar20 + 4;
            } while (pcVar14 < pcVar15);
            uVar4 = *puVar18;
            puVar20 = puVar18 + 1;
            pcVar17 = pcVar15 + -(ulong)uVar4;
            uVar11 = (ulong)(bVar3 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= puVar18) ||
               (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar14)) goto LAB_00112279;
            uVar6 = *(undefined8 *)((long)puVar20 + 9);
            *(undefined8 *)pcVar14 = *(undefined8 *)puVar18;
            *(undefined8 *)(pcVar14 + 8) = uVar6;
            pcVar15 = pcVar14 + sVar12;
            uVar11 = (ulong)(bVar3 & 0xf);
            puVar20 = (ushort *)((long)puVar18 + sVar12) + 1;
            uVar4 = *(ushort *)((long)puVar18 + sVar12);
            pcVar17 = pcVar15 + -(ulong)uVar4;
            if ((uVar11 != 0xf) && ((7 < uVar4 && (dest <= pcVar17)))) {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar17;
              *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)(pcVar17 + 8);
              *(undefined2 *)(pcVar15 + 0x10) = *(undefined2 *)(pcVar17 + 0x10);
              pcVar14 = pcVar15 + uVar11 + 4;
              goto LAB_00112200;
            }
          }
          if ((int)uVar11 == 0xf) {
            lStack_60 = 0;
            puVar18 = puVar20;
            do {
              puVar20 = (ushort *)((long)puVar18 + 1);
              if (pbVar2 + -4 < puVar20) {
                lStack_60 = -1;
                break;
              }
              uVar7 = *puVar18;
              lStack_60 = lStack_60 + (ulong)(byte)uVar7;
              puVar18 = puVar20;
            } while ((ulong)(byte)uVar7 == 0xff);
            uVar11 = lStack_60 + 0xf;
            if ((lStack_60 == -1) || (CARRY8((ulong)pcVar15,uVar11))) goto LAB_001124c3;
          }
          if (pcVar17 < dest) goto LAB_001124c3;
          if (uVar4 < 8) {
            pcVar15[0] = '\0';
            pcVar15[1] = '\0';
            pcVar15[2] = '\0';
            pcVar15[3] = '\0';
            *pcVar15 = *pcVar17;
            pcVar15[1] = pcVar17[1];
            pcVar15[2] = pcVar17[2];
            pcVar15[3] = pcVar17[3];
            uVar5 = inc32table[uVar4];
            *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar17 + uVar5);
            pcVar17 = pcVar17 + ((ulong)uVar5 - (long)dec64table[uVar4]);
          }
          else {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar17;
            pcVar17 = pcVar17 + 8;
          }
          pcVar14 = pcVar15 + uVar11 + 4;
          pcVar21 = pcVar15 + 8;
          if (pcVar14 <= pcVar22 + -0xc) {
            *(undefined8 *)pcVar21 = *(undefined8 *)pcVar17;
            if (0x10 < uVar11 + 4) {
              pcVar15 = pcVar15 + 0x10;
              do {
                pcVar17 = pcVar17 + 8;
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar17;
                pcVar15 = pcVar15 + 8;
              } while (pcVar15 < pcVar14);
            }
            goto LAB_00112200;
          }
          iVar8 = 5;
          if (pcVar14 <= pcVar22 + -5) {
            pcVar15 = pcVar17;
            pcVar24 = pcVar21;
            if (pcVar21 < pcVar9) {
              do {
                *(undefined8 *)pcVar24 = *(undefined8 *)pcVar15;
                pcVar24 = pcVar24 + 8;
                pcVar15 = pcVar15 + 8;
              } while (pcVar24 < pcVar9);
              pcVar17 = pcVar17 + ((long)pcVar9 - (long)pcVar21);
              pcVar21 = pcVar9;
            }
            iVar8 = 0;
            for (; pcVar21 < pcVar14; pcVar21 = pcVar21 + 1) {
              cVar23 = *pcVar17;
              pcVar17 = pcVar17 + 1;
              *pcVar21 = cVar23;
            }
          }
        } while (iVar8 == 0);
        if (iVar8 == 5) {
LAB_001124c3:
          puVar20 = (ushort *)(ulong)(~(uint)puVar20 + iStack_58);
        }
      }
    }
LAB_001124c8:
    return (int)puVar20;
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize != dest) {
    iVar8 = -1;
    if (-1 < maxOutputSize && source != (char *)0x0) {
      pcVar9 = dictStart + prefixSize;
      if (dictStart == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar8 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        pbVar2 = (byte *)(source + compressedSize);
        pcVar14 = dest + (uint)maxOutputSize;
        pcVar22 = pcVar14 + -7;
        pcVar15 = dest;
        puVar20 = (ushort *)source;
LAB_00112cf3:
        uVar10 = 0xf;
        puVar18 = (ushort *)((long)puVar20 + 1);
        bVar3 = (byte)*puVar20;
        uVar11 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          lStack_b0 = -1;
          if (puVar18 < pbVar2 + -0xf) {
            lStack_b0 = 0;
            puVar20 = puVar20 + 1;
            do {
              puVar18 = puVar20;
              if (pbVar2 + -0xf < puVar18) {
                lStack_b0 = -1;
                break;
              }
              lStack_b0 = lStack_b0 + (ulong)*(byte *)((long)puVar18 + -1);
              puVar20 = (ushort *)((long)puVar18 + 1);
            } while ((ulong)*(byte *)((long)puVar18 + -1) == 0xff);
          }
          cVar23 = '\x05';
          if (lStack_b0 != -1) {
            uVar10 = lStack_b0 + 0xf;
            if (CARRY8((ulong)pcVar15,uVar10)) {
              cVar23 = '\x05';
            }
            else {
              cVar23 = CARRY8((ulong)puVar18,uVar10) * '\x05';
            }
          }
          uVar11 = uVar10;
          if (cVar23 != '\0') goto LAB_0011308b;
LAB_00112d6f:
          pcVar17 = pcVar15 + uVar11;
          if ((pcVar14 + -0xc < pcVar17) ||
             (puVar20 = (ushort *)((long)puVar18 + uVar11), pbVar2 + -8 < puVar20)) {
            if (((byte *)((long)puVar18 + uVar11) == pbVar2) && (pcVar17 <= pcVar14)) {
              memmove(pcVar15,puVar18,uVar11);
              return (int)pcVar17 - (int)dest;
            }
            goto LAB_001130b6;
          }
          do {
            *(undefined8 *)pcVar15 = *(undefined8 *)puVar18;
            pcVar15 = pcVar15 + 8;
            puVar18 = puVar18 + 4;
          } while (pcVar15 < pcVar17);
          uVar4 = *puVar20;
          puVar18 = puVar20 + 1;
          pcVar21 = pcVar17 + -(ulong)uVar4;
          uVar10 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= puVar18) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar15)) goto LAB_00112d6f;
          uVar6 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)pcVar15 = *(undefined8 *)puVar18;
          *(undefined8 *)(pcVar15 + 8) = uVar6;
          pcVar17 = pcVar15 + uVar11;
          uVar10 = (ulong)(bVar3 & 0xf);
          puVar20 = (ushort *)((long)puVar18 + uVar11);
          puVar18 = puVar20 + 1;
          uVar4 = *puVar20;
          pcVar21 = pcVar17 + -(ulong)uVar4;
          if ((uVar10 != 0xf) && ((7 < uVar4 && (dest <= pcVar21)))) {
            *(undefined8 *)pcVar17 = *(undefined8 *)pcVar21;
            *(undefined8 *)(pcVar17 + 8) = *(undefined8 *)(pcVar21 + 8);
            *(undefined2 *)(pcVar17 + 0x10) = *(undefined2 *)(pcVar21 + 0x10);
            pcVar15 = pcVar17 + uVar10 + 4;
            puVar20 = puVar18;
            goto LAB_00112cf3;
          }
        }
        if ((int)uVar10 == 0xf) {
          lStack_b0 = 0;
          puVar20 = puVar18;
          do {
            puVar18 = (ushort *)((long)puVar20 + 1);
            if (pbVar2 + -4 < puVar18) {
              lStack_b0 = -1;
              break;
            }
            uVar7 = *puVar20;
            lStack_b0 = lStack_b0 + (ulong)(byte)uVar7;
            puVar20 = puVar18;
          } while ((ulong)(byte)uVar7 == 0xff);
          uVar10 = lStack_b0 + 0xf;
          if ((lStack_b0 == -1) || (CARRY8((ulong)pcVar17,uVar10))) goto LAB_001130b6;
        }
        if ((prefixSize < 0x10000) && (pcVar21 + prefixSize < dest)) goto LAB_001130b6;
        uVar10 = uVar10 + 4;
        pcVar24 = pcVar17 + uVar10;
        pcVar15 = pcVar24;
        puVar20 = puVar18;
        if (pcVar21 < dest) {
          if (pcVar14 + -5 < pcVar24) goto LAB_001130b6;
          uVar16 = (long)dest - (long)pcVar21;
          uVar11 = uVar10 - uVar16;
          if (uVar10 < uVar16 || uVar11 == 0) {
            memmove(pcVar17,pcVar9 + -uVar16,uVar10);
          }
          else {
            memcpy(pcVar17,pcVar9 + -uVar16,uVar16);
            pcVar15 = pcVar17 + uVar16;
            if ((ulong)((long)pcVar15 - (long)dest) < uVar11) {
              pcVar17 = dest;
              if ((long)uVar16 < (long)uVar10) {
                do {
                  *pcVar15 = *pcVar17;
                  pcVar15 = pcVar15 + 1;
                  pcVar17 = pcVar17 + 1;
                } while (pcVar15 < pcVar24);
              }
            }
            else {
              memcpy(pcVar15,dest,uVar11);
              pcVar15 = pcVar24;
            }
          }
          goto LAB_00112cf3;
        }
        if (uVar4 < 8) {
          pcVar17[0] = '\0';
          pcVar17[1] = '\0';
          pcVar17[2] = '\0';
          pcVar17[3] = '\0';
          *pcVar17 = *pcVar21;
          pcVar17[1] = pcVar21[1];
          pcVar17[2] = pcVar21[2];
          pcVar17[3] = pcVar21[3];
          uVar5 = inc32table[uVar4];
          *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar21 + uVar5);
          pcVar21 = pcVar21 + ((ulong)uVar5 - (long)dec64table[uVar4]);
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar21;
          pcVar21 = pcVar21 + 8;
        }
        pcVar1 = pcVar17 + 8;
        if (pcVar24 <= pcVar14 + -0xc) {
          *(undefined8 *)pcVar1 = *(undefined8 *)pcVar21;
          if (0x10 < uVar10) {
            pcVar17 = pcVar17 + 0x10;
            do {
              pcVar21 = pcVar21 + 8;
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar21;
              pcVar17 = pcVar17 + 8;
            } while (pcVar17 < pcVar24);
          }
          goto LAB_00112cf3;
        }
        cVar23 = '\x05';
        if (pcVar24 <= pcVar14 + -5) {
          pcVar17 = pcVar21;
          pcVar19 = pcVar1;
          if (pcVar1 < pcVar22) {
            do {
              *(undefined8 *)pcVar19 = *(undefined8 *)pcVar17;
              pcVar19 = pcVar19 + 8;
              pcVar17 = pcVar17 + 8;
            } while (pcVar19 < pcVar22);
            pcVar21 = pcVar21 + ((long)pcVar22 - (long)pcVar1);
            pcVar1 = pcVar22;
          }
          for (; cVar23 = '\0', pcVar1 < pcVar24; pcVar1 = pcVar1 + 1) {
            cVar23 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar1 = cVar23;
          }
        }
        if (cVar23 == '\0') goto LAB_00112cf3;
LAB_0011308b:
        iVar8 = (int)puVar18;
        if (cVar23 == '\x05') {
LAB_001130b6:
          iVar8 = ~(uint)puVar18 + iStack_58;
        }
      }
    }
    return iVar8;
  }
  if (dictSize < 0xffff) {
    iVar8 = LZ4_decompress_safe_withSmallPrefix(source,dest,compressedSize,maxOutputSize,prefixSize)
    ;
    return iVar8;
  }
  puVar20 = (ushort *)0xffffffffffffffff;
  iVar8 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar20 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      uVar11 = (ulong)(uint)maxOutputSize;
      pcVar9 = dest + (uVar11 - 7);
      lVar13 = 0;
      puVar20 = (ushort *)source;
LAB_00112936:
      do {
        pcVar22 = dest + lVar13;
        puVar18 = (ushort *)((long)puVar20 + 1);
        bVar3 = (byte)*puVar20;
        sVar12 = (size_t)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          lStack_60 = -1;
          if (puVar18 < pbVar2 + -0xf) {
            lStack_60 = 0;
            puVar20 = puVar20 + 1;
            do {
              puVar18 = puVar20;
              if (pbVar2 + -0xf < puVar18) {
                lStack_60 = -1;
                break;
              }
              lStack_60 = lStack_60 + (ulong)*(byte *)((long)puVar18 + -1);
              puVar20 = (ushort *)((long)puVar18 + 1);
            } while ((ulong)*(byte *)((long)puVar18 + -1) == 0xff);
          }
          puVar20 = puVar18;
          cVar23 = '\x05';
          sVar12 = 0xf;
          if ((lStack_60 != -1) && (sVar12 = lStack_60 + 0xf, !CARRY8((ulong)pcVar22,sVar12))) {
            cVar23 = CARRY8((ulong)puVar20,sVar12) * '\x05';
          }
          puVar18 = puVar20;
          if (cVar23 != '\0') {
            if (cVar23 == '\x05') goto LAB_00112c06;
            goto LAB_00112c0b;
          }
LAB_001129b0:
          puVar20 = puVar18;
          uVar16 = lVar13 + sVar12;
          if ((dest + (uVar11 - 0xc) < dest + uVar16) ||
             (puVar18 = (ushort *)((long)puVar20 + sVar12), pbVar2 + -8 < puVar18)) {
            if (((byte *)((long)puVar20 + sVar12) != pbVar2) || ((long)uVar11 < (long)uVar16))
            goto LAB_00112c06;
            memmove(pcVar22,puVar20,sVar12);
            puVar20 = (ushort *)(uVar16 & 0xffffffff);
            goto LAB_00112c0b;
          }
          do {
            *(undefined8 *)pcVar22 = *(undefined8 *)puVar20;
            pcVar22 = pcVar22 + 8;
            puVar20 = puVar20 + 4;
          } while (pcVar22 < dest + uVar16);
          uVar4 = *puVar18;
          puVar20 = puVar18 + 1;
          lVar13 = uVar16 - uVar4;
          uVar10 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= puVar18) ||
             (dest + (uVar11 - 0x20) < pcVar22)) goto LAB_001129b0;
          uVar6 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)pcVar22 = *(undefined8 *)puVar18;
          *(undefined8 *)(pcVar22 + 8) = uVar6;
          uVar16 = lVar13 + sVar12;
          uVar10 = (ulong)(bVar3 & 0xf);
          puVar20 = (ushort *)((long)puVar18 + sVar12) + 1;
          uVar4 = *(ushort *)((long)puVar18 + sVar12);
          lVar13 = uVar16 - uVar4;
          if (7 < uVar4 && uVar10 != 0xf) {
            *(undefined8 *)(dest + uVar16) = *(undefined8 *)(dest + lVar13);
            *(undefined8 *)(dest + uVar16 + 8) = *(undefined8 *)(dest + lVar13 + 8);
            *(undefined2 *)(dest + uVar16 + 0x10) = *(undefined2 *)(dest + lVar13 + 0x10);
            lVar13 = uVar16 + uVar10 + 4;
            goto LAB_00112936;
          }
        }
        pcVar22 = dest + uVar16;
        if ((int)uVar10 == 0xf) {
          lStack_60 = 0;
          puVar18 = puVar20;
          do {
            puVar20 = (ushort *)((long)puVar18 + 1);
            if (pbVar2 + -4 < puVar20) {
              lStack_60 = -1;
              break;
            }
            uVar7 = *puVar18;
            lStack_60 = lStack_60 + (ulong)(byte)uVar7;
            puVar18 = puVar20;
          } while ((ulong)(byte)uVar7 == 0xff);
          uVar10 = lStack_60 + 0xf;
          if ((lStack_60 == -1) || (CARRY8((ulong)pcVar22,uVar10))) goto LAB_00112c06;
        }
        if (lVar13 < -0x10000) goto LAB_00112c06;
        pcVar14 = dest + lVar13;
        if (uVar4 < 8) {
          pcVar22[0] = '\0';
          pcVar22[1] = '\0';
          pcVar22[2] = '\0';
          pcVar22[3] = '\0';
          *pcVar22 = *pcVar14;
          pcVar22[1] = pcVar14[1];
          pcVar22[2] = pcVar14[2];
          pcVar22[3] = pcVar14[3];
          uVar5 = inc32table[uVar4];
          *(undefined4 *)(pcVar22 + 4) = *(undefined4 *)(pcVar14 + uVar5);
          pcVar14 = pcVar14 + ((ulong)uVar5 - (long)dec64table[uVar4]);
        }
        else {
          *(undefined8 *)pcVar22 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        lVar13 = uVar16 + uVar10 + 4;
        pcVar17 = dest + lVar13;
        pcVar15 = pcVar22 + 8;
        if (pcVar17 <= dest + (uVar11 - 0xc)) {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar14;
          if (0x10 < uVar10 + 4) {
            pcVar22 = pcVar22 + 0x10;
            do {
              pcVar14 = pcVar14 + 8;
              *(undefined8 *)pcVar22 = *(undefined8 *)pcVar14;
              pcVar22 = pcVar22 + 8;
            } while (pcVar22 < pcVar17);
          }
          goto LAB_00112936;
        }
        iVar8 = 5;
        if (pcVar17 <= dest + (uVar11 - 5)) {
          pcVar22 = pcVar14;
          pcVar21 = pcVar15;
          if (pcVar15 < pcVar9) {
            do {
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
              pcVar21 = pcVar21 + 8;
              pcVar22 = pcVar22 + 8;
            } while (pcVar21 < pcVar9);
            pcVar14 = pcVar14 + ((long)pcVar9 - (long)pcVar15);
            pcVar15 = pcVar9;
          }
          iVar8 = 0;
          for (; pcVar15 < pcVar17; pcVar15 = pcVar15 + 1) {
            cVar23 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar15 = cVar23;
          }
        }
      } while (iVar8 == 0);
      if (iVar8 == 5) {
LAB_00112c06:
        puVar20 = (ushort *)(ulong)(~(uint)puVar20 + iStack_58);
      }
    }
LAB_00112c0b:
    iVar8 = (int)puVar20;
  }
  return iVar8;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}